

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ScriptModuleType SVar3;
  WastParseOptions *pWVar4;
  pointer data;
  _func_int **pp_Var5;
  Command *pCVar6;
  undefined4 uVar7;
  CommandType CVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  size_t sVar11;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> base;
  pointer pEVar12;
  Result RVar13;
  TextScriptModule *pTVar14;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar15;
  Command *pCVar16;
  long lVar17;
  Module *pMVar18;
  Index IVar19;
  pointer pEVar20;
  allocator<char> local_b9;
  Command *local_b8;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_b0;
  ScriptModule *local_a8;
  CommandPtr *local_a0;
  Module *local_98;
  Script *local_90;
  ReadBinaryOptions options;
  Errors errors;
  
  local_b0._M_head_impl = (ScriptModule *)0x0;
  RVar13 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_b0);
  base._M_head_impl = local_b0._M_head_impl;
  if (RVar13.enum_ == Error) {
    RVar13.enum_ = Error;
    goto LAB_001365c7;
  }
  SVar3 = (local_b0._M_head_impl)->type_;
  if (SVar3 == Quoted) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options,"a binary module",(allocator<char> *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options.read_debug_names,"a text module",&local_b9);
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errors,&options
               ,&errors);
    RVar13 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&errors,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&errors);
    lVar17 = 0x20;
    do {
      std::__cxx11::string::_M_dispose();
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != -0x20);
    goto LAB_001365c7;
  }
  if (SVar3 == Binary) {
    local_a0 = out_command;
    local_90 = script;
    std::make_unique<wabt::ScriptModuleCommand>();
    pCVar16 = local_b8;
    pMVar18 = (Module *)(local_b8 + 1);
    local_a8 = base._M_head_impl;
    pDVar15 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                        (base._M_head_impl);
    ReadBinaryOptions::ReadBinaryOptions(&options);
    pWVar4 = this->options_;
    uVar1 = (pWVar4->features).extended_const_enabled_;
    uVar2 = (pWVar4->features).relaxed_simd_enabled_;
    options.features.relaxed_simd_enabled_ = (bool)uVar2;
    options.features.extended_const_enabled_ = (bool)uVar1;
    options.features.exceptions_enabled_ = (pWVar4->features).exceptions_enabled_;
    options.features.mutable_globals_enabled_ = (pWVar4->features).mutable_globals_enabled_;
    options.features.sat_float_to_int_enabled_ = (pWVar4->features).sat_float_to_int_enabled_;
    options.features.sign_extension_enabled_ = (pWVar4->features).sign_extension_enabled_;
    options.features.simd_enabled_ = (pWVar4->features).simd_enabled_;
    options.features.threads_enabled_ = (pWVar4->features).threads_enabled_;
    options.features.function_references_enabled_ = (pWVar4->features).function_references_enabled_;
    options.features.multi_value_enabled_ = (pWVar4->features).multi_value_enabled_;
    options.features.tail_call_enabled_ = (pWVar4->features).tail_call_enabled_;
    options.features.bulk_memory_enabled_ = (pWVar4->features).bulk_memory_enabled_;
    options.features.reference_types_enabled_ = (pWVar4->features).reference_types_enabled_;
    options.features.annotations_enabled_ = (pWVar4->features).annotations_enabled_;
    options.features.code_metadata_enabled_ = (pWVar4->features).code_metadata_enabled_;
    options.features.gc_enabled_ = (pWVar4->features).gc_enabled_;
    options.features.memory64_enabled_ = (pWVar4->features).memory64_enabled_;
    options.features.multi_memory_enabled_ = (pWVar4->features).multi_memory_enabled_;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data = (pDVar15->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
    local_98 = pMVar18;
    ReadBinaryIr("<text>",data,
                 (long)(pDVar15->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)data,&options,&errors,pMVar18);
    std::__cxx11::string::_M_assign((string *)(pCVar16 + 3));
    pEVar12 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar11 = (pDVar15->loc).filename._M_len;
    uVar7 = *(undefined4 *)((long)&(pDVar15->loc).filename._M_len + 4);
    CVar8 = *(CommandType *)&(pDVar15->loc).filename._M_str;
    uVar9 = *(undefined4 *)((long)&(pDVar15->loc).filename._M_str + 4);
    uVar10 = *(undefined8 *)((long)&(pDVar15->loc).field_1 + 8);
    pCVar16[2]._vptr_Command = (_func_int **)(pDVar15->loc).field_1.field_1.offset;
    *(undefined8 *)&pCVar16[2].type = uVar10;
    *(int *)&pCVar16[1]._vptr_Command = (int)sVar11;
    *(undefined4 *)((long)&pCVar16[1]._vptr_Command + 4) = uVar7;
    pCVar16[1].type = CVar8;
    *(undefined4 *)&pCVar16[1].field_0xc = uVar9;
    for (pEVar20 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar20 != pEVar12; pEVar20 = pEVar20 + 1) {
      if (pEVar20->error_level != Error) {
        __assert_fail("error.error_level == ErrorLevel::Error",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0xd05,"Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
      }
      if ((pEVar20->loc).field_1.field_1.offset == 0xffffffffffffffff) {
        Error(this,0x1734b0,(pEVar20->message)._M_dataplus._M_p);
      }
      else {
        Error(this,0x1734cb);
      }
    }
    local_b0._M_head_impl = (ScriptModule *)0x0;
    pp_Var5 = local_b8[0x38]._vptr_Command;
    local_b8[0x38]._vptr_Command = (_func_int **)local_a8;
    pCVar16 = local_b8;
    if (pp_Var5 != (_func_int **)0x0) {
      (**(code **)(*pp_Var5 + 8))();
      pCVar16 = local_b8;
    }
    script = local_90;
    pMVar18 = local_98;
    local_b8 = (Command *)0x0;
    pCVar6 = (local_a0->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (local_a0->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar16;
    if (pCVar6 != (Command *)0x0) {
      (*pCVar6->_vptr_Command[1])();
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
    pCVar16 = local_b8;
LAB_00136573:
    if (pCVar16 != (Command *)0x0) {
      (*pCVar16->_vptr_Command[1])();
    }
  }
  else if (SVar3 == Text) {
    std::make_unique<wabt::ModuleCommand>();
    pMVar18 = (Module *)(options.features._0_8_ + 0x10);
    pTVar14 = cast<wabt::TextScriptModule,wabt::ScriptModule>(base._M_head_impl);
    Module::operator=(pMVar18,&pTVar14->module);
    uVar10 = options.features._0_8_;
    options.features.exceptions_enabled_ = false;
    options.features.mutable_globals_enabled_ = false;
    options.features.sat_float_to_int_enabled_ = false;
    options.features.sign_extension_enabled_ = false;
    options.features.simd_enabled_ = false;
    options.features.threads_enabled_ = false;
    options.features.function_references_enabled_ = false;
    options.features.multi_value_enabled_ = false;
    pCVar16 = (out_command->_M_t).
              super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
              super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
              super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)uVar10;
    if (pCVar16 != (Command *)0x0) {
      (*pCVar16->_vptr_Command[1])();
      pCVar16 = (Command *)options.features._0_8_;
      goto LAB_00136573;
    }
  }
  else {
    pMVar18 = (Module *)0x0;
  }
  RVar13.enum_ = Ok;
  if (script != (Script *)0x0) {
    IVar19 = (Index)((ulong)((long)(script->commands).
                                   super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(script->commands).
                                  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if ((pMVar18->name)._M_string_length != 0) {
      options.features._0_8_ = (pMVar18->loc).filename._M_len;
      options.features._8_8_ = (pMVar18->loc).filename._M_str;
      options._16_4_ = (pMVar18->loc).field_1.field_0.line;
      options._20_4_ = (pMVar18->loc).field_1.field_0.first_column;
      options.log_stream._0_4_ = (pMVar18->loc).field_1.field_0.last_column;
      options.log_stream._4_4_ = *(undefined4 *)((long)&(pMVar18->loc).field_1 + 0xc);
      options._32_4_ = IVar19;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&script->module_bindings,&pMVar18->name);
    }
    this->last_module_index_ = IVar19;
    RVar13.enum_ = Ok;
  }
LAB_001365c7:
  if (local_b0._M_head_impl != (ScriptModule *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar13.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, module);
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}